

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O1

void amrex::UtilRenameDirectoryToOld(string *path,bool callbarrier)

{
  long *plVar1;
  ostringstream *this;
  pointer pcVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  string newoldname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_1f0;
  long local_1e0;
  undefined8 uStack_1d8;
  ostream **local_1d0;
  long local_1c8;
  ostream *local_1c0 [2];
  undefined1 local_1b0 [24];
  undefined8 auStack_198 [46];
  
  if (*(int *)(DAT_00842950 + -0x3c) != *(int *)(DAT_00842950 + -0x30)) goto LAB_0053a940;
  bVar4 = FileSystem::Exists(path);
  if (!bVar4) goto LAB_0053a940;
  this = (ostringstream *)(local_1b0 + 0x10);
  pcVar2 = (path->_M_dataplus)._M_p;
  local_1b0._0_8_ = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b0,pcVar2,pcVar2 + path->_M_string_length);
  std::__cxx11::string::append((char *)local_1b0);
  UniqueString_abi_cxx11_();
  poVar7 = (ostream *)0xf;
  if ((ostringstream *)local_1b0._0_8_ != this) {
    poVar7 = (ostream *)local_1b0._16_8_;
  }
  if (poVar7 < (ostream *)(local_1b0._8_8_ + local_1c8)) {
    poVar7 = (ostream *)0xf;
    if (local_1d0 != local_1c0) {
      poVar7 = local_1c0[0];
    }
    if (poVar7 < (ostream *)(local_1b0._8_8_ + local_1c8)) goto LAB_0053a7b4;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,local_1b0._0_8_);
  }
  else {
LAB_0053a7b4:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append(local_1b0,(ulong)local_1d0);
  }
  local_1f0 = &local_1e0;
  plVar1 = puVar6 + 2;
  if ((long *)*puVar6 == plVar1) {
    local_1e0 = *plVar1;
    uStack_1d8 = puVar6[3];
  }
  else {
    local_1e0 = *plVar1;
    local_1f0 = (long *)*puVar6;
  }
  lVar3 = puVar6[1];
  *puVar6 = plVar1;
  puVar6[1] = 0;
  *(undefined1 *)plVar1 = 0;
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,(ulong)(local_1c0[0] + 1));
  }
  if ((ostringstream *)local_1b0._0_8_ != this) {
    operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
  }
  iVar5 = Verbose();
  if (1 < iVar5) {
    local_1b0._8_8_ = OutStream();
    local_1b0._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
    local_1b0._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
    std::__cxx11::ostringstream::ostringstream(this);
    *(undefined8 *)((long)auStack_198 + *(long *)(local_1b0._16_8_ - 0x18)) =
         *(undefined8 *)(local_1b0._8_8_ + *(long *)(*(long *)local_1b0._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"amrex::UtilRenameDirectoryToOld():  ",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,(path->_M_dataplus)._M_p,path->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this," exists.  Renaming to:  ",0x18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,(char *)local_1f0,lVar3);
    std::ios::widen((char)*(undefined8 *)(local_1b0._16_8_ - 0x18) + (char)this);
    std::ostream::put((char)this);
    std::ostream::flush();
    Print::~Print((Print *)local_1b0);
  }
  rename((path->_M_dataplus)._M_p,(char *)local_1f0);
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
LAB_0053a940:
  if (callbarrier) {
    local_1b0._0_8_ = local_1b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"amrex::UtilRenameDirectoryToOld","");
    ParallelDescriptor::Barrier((string *)local_1b0);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
    }
  }
  return;
}

Assistant:

void
amrex::UtilRenameDirectoryToOld (const std::string &path, bool callbarrier)
{
  if(ParallelContext::IOProcessorSub()) {
    if(amrex::FileExists(path)) {
      std::string newoldname(path + ".old." + amrex::UniqueString());
      if (amrex::Verbose() > 1) {
          amrex::Print() << "amrex::UtilRenameDirectoryToOld():  " << path
                         << " exists.  Renaming to:  " << newoldname << std::endl;
      }
      std::rename(path.c_str(), newoldname.c_str());
    }
  }
  if(callbarrier) {
    // Force other processors to wait until directory is renamed.
    ParallelDescriptor::Barrier("amrex::UtilRenameDirectoryToOld");
  }
}